

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  RemoveConst<kj::_::CidrRange> *pRVar1;
  NetworkFilter *pNVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  uint uVar7;
  CidrRange *cidr;
  CidrRange *pCVar8;
  ArrayPtr<const_char> AVar9;
  long lStack_50;
  Fault f;
  
  if (addrlen < 2) {
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                        ,0x8c3,FAILED,"addrlen >= sizeof(addr->sa_family)","");
    Debug::Fault::fatal(&f);
  }
  if (addr->sa_family == 1) {
    AVar9 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar9.size_ == 0) || (*AVar9.ptr != '\0')) {
      lStack_50 = 0x48;
    }
    else {
      lStack_50 = 0x49;
    }
    uVar5 = *(undefined1 *)((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lStack_50);
  }
  else {
    pRVar1 = (this->allowCidrs).builder.pos;
    uVar7 = 0;
    bVar4 = false;
    for (pCVar8 = (this->allowCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
      bVar3 = CidrRange::matches(pCVar8,addr);
      if (bVar3) {
        if (uVar7 <= pCVar8->bitCount) {
          uVar7 = pCVar8->bitCount;
        }
        bVar4 = true;
      }
    }
    if (bVar4) {
      pRVar1 = (this->denyCidrs).builder.pos;
      for (pCVar8 = (this->denyCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
        bVar4 = CidrRange::matches(pCVar8,addr);
        if ((bVar4) && (uVar7 <= pCVar8->bitCount)) goto LAB_002df9cd;
      }
      pNVar2 = (this->next).ptr;
      if (pNVar2 != (NetworkFilter *)0x0) {
        iVar6 = (**(pNVar2->super_NetworkFilter)._vptr_NetworkFilter)(pNVar2,addr,(ulong)addrlen);
        return SUB41(iVar6,0);
      }
      uVar5 = 1;
    }
    else {
LAB_002df9cd:
      uVar5 = 0;
    }
  }
  return (bool)uVar5;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;
  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_MAYBE(n, next) {
    return n->shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}